

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void getenv_test(void)

{
  ostream *poVar1;
  string val;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,"IN_TESTSUITE: ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"IN_TESTSUITE",&local_49);
  QUtil::get_env(&local_48,&local_28);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)&local_28);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"HAGOOGAMAGOOGLE: ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"HAGOOGAMAGOOGLE",&local_49);
  QUtil::get_env(&local_48,(string *)0x0);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void
getenv_test()
{
    std::string val;
    std::cout << "IN_TESTSUITE: " << QUtil::get_env("IN_TESTSUITE", &val) << ": " << val
              << std::endl;
    // Hopefully this environment variable is not defined.
    std::cout << "HAGOOGAMAGOOGLE: " << QUtil::get_env("HAGOOGAMAGOOGLE") << std::endl;
}